

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::~runner
          (runner<ApprovalTests::cfg::reporter,_16> *this)

{
  bool bVar1;
  
  bVar1 = this->run_;
  if (bVar1 == false) {
    run(this,(run_cfg)0x0);
  }
  if (this->dry_run_ == false) {
    reporter<boost::ext::ut::v1_1_8::printer>::on((reporter<boost::ext::ut::v1_1_8::printer> *)this)
    ;
  }
  if ((bVar1 == false) && (this->fails_ != 0)) {
    exit(-1);
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&(this->tag_).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&this->filter_);
  std::_Vector_base<void_(*)(),_std::allocator<void_(*)()>_>::~_Vector_base
            (&(this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>);
  ApprovalTests::cfg::reporter::~reporter(&this->reporter_);
  return;
}

Assistant:

~runner() {
      const auto should_run = not run_;

      if (should_run) {
        static_cast<void>(run());
      }

      if (not dry_run_) {
        reporter_.on(events::summary{});
      }

      if (should_run and fails_) {
        std::exit(-1);
      }
    }